

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

size_t cookiehash(char *domain)

{
  _Bool _Var1;
  char *__n;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  
  if (domain != (char *)0x0) {
    _Var1 = isip(domain);
    if (!_Var1) {
      __n = (char *)strlen(domain);
      pvVar2 = memchr(domain,0x2e,(size_t)__n);
      pvVar3 = Curl_memrchr(domain,0x2e,(size_t)__n);
      if (pvVar2 != pvVar3) {
        pvVar2 = Curl_memrchr(domain,0x2e,(long)pvVar3 + ~(ulong)domain);
        __n = domain + (long)(__n + ~(ulong)pvVar2);
        domain = (char *)((long)pvVar2 + 1);
      }
      sVar4 = Curl_hash_str(domain,(size_t)__n,0x100);
      return sVar4;
    }
  }
  return 0;
}

Assistant:

static size_t cookiehash(const char * const domain)
{
  const char *top;
  size_t len;

  if(!domain || isip(domain))
    return 0;

  top = get_top_domain(domain, &len);
  return Curl_hash_str((void *) top, len, COOKIE_HASH_SIZE);
}